

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WalExclusiveMode(Wal *pWal,int op)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  int rc;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  uint uVar2;
  
  if (in_ESI == 0) {
    if (*(char *)(in_RDI + 0x3f) == '\0') {
      uVar2 = 0;
    }
    else {
      *(undefined1 *)(in_RDI + 0x3f) = 0;
      iVar1 = walLockShared((Wal *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),0);
      if (iVar1 != 0) {
        *(undefined1 *)(in_RDI + 0x3f) = 1;
      }
      uVar2 = (uint)(*(char *)(in_RDI + 0x3f) == '\0');
    }
  }
  else if (in_ESI < 1) {
    uVar2 = (uint)(*(char *)(in_RDI + 0x3f) == '\0');
  }
  else {
    walUnlockShared((Wal *)CONCAT44(in_ESI,0xaaaaaaaa),in_stack_ffffffffffffffec);
    *(undefined1 *)(in_RDI + 0x3f) = 1;
    uVar2 = 1;
  }
  return uVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalExclusiveMode(Wal *pWal, int op){
  int rc;
  assert( pWal->writeLock==0 );
  assert( pWal->exclusiveMode!=WAL_HEAPMEMORY_MODE || op==-1 );

  /* pWal->readLock is usually set, but might be -1 if there was a
  ** prior error while attempting to acquire are read-lock. This cannot
  ** happen if the connection is actually in exclusive mode (as no xShmLock
  ** locks are taken in this case). Nor should the pager attempt to
  ** upgrade to exclusive-mode following such an error.
  */
#ifndef SQLITE_USE_SEH
  assert( pWal->readLock>=0 || pWal->lockError );
#endif
  assert( pWal->readLock>=0 || (op<=0 && pWal->exclusiveMode==0) );

  if( op==0 ){
    if( pWal->exclusiveMode!=WAL_NORMAL_MODE ){
      pWal->exclusiveMode = WAL_NORMAL_MODE;
      if( walLockShared(pWal, WAL_READ_LOCK(pWal->readLock))!=SQLITE_OK ){
        pWal->exclusiveMode = WAL_EXCLUSIVE_MODE;
      }
      rc = pWal->exclusiveMode==WAL_NORMAL_MODE;
    }else{
      /* Already in locking_mode=NORMAL */
      rc = 0;
    }
  }else if( op>0 ){
    assert( pWal->exclusiveMode==WAL_NORMAL_MODE );
    assert( pWal->readLock>=0 );
    walUnlockShared(pWal, WAL_READ_LOCK(pWal->readLock));
    pWal->exclusiveMode = WAL_EXCLUSIVE_MODE;
    rc = 1;
  }else{
    rc = pWal->exclusiveMode==WAL_NORMAL_MODE;
  }
  return rc;
}